

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackRPMGenerator.cxx
# Opt level: O0

int __thiscall cmCPackRPMGenerator::PackageComponents(cmCPackRPMGenerator *this,bool ignoreGroup)

{
  cmCPackLog *pcVar1;
  undefined4 uVar2;
  bool bVar3;
  uint uVar4;
  char *pcVar5;
  pointer ppVar6;
  pointer ppVar7;
  ostream *poVar8;
  string local_4a8;
  string local_488;
  _Self local_468;
  _Base_ptr local_460;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>_>
  local_458;
  iterator compIt_1;
  string local_430;
  string local_410 [32];
  undefined1 local_3f0 [8];
  ostringstream cmCPackLog_msg_1;
  _Self local_278;
  _Base_ptr local_270;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>_>
  local_268;
  iterator compIt;
  string local_240;
  string local_220 [32];
  undefined1 local_200 [8];
  ostringstream cmCPackLog_msg;
  _Self local_88;
  _Base_ptr local_80;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponentGroup>_>
  local_78;
  iterator compGIt;
  allocator local_59;
  string local_58;
  string local_38 [8];
  string initialTopLevel;
  int retval;
  bool ignoreGroup_local;
  cmCPackRPMGenerator *this_local;
  
  initialTopLevel.field_2._8_4_ = 1;
  initialTopLevel.field_2._M_local_buf[0xf] = ignoreGroup;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&(this->super_cmCPackGenerator).packageFileNames);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_58,"CPACK_TEMPORARY_DIRECTORY",&local_59);
  pcVar5 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_58);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,pcVar5,(allocator *)((long)&compGIt._M_node + 3));
  std::allocator<char>::~allocator((allocator<char> *)((long)&compGIt._M_node + 3));
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  if ((initialTopLevel.field_2._M_local_buf[0xf] & 1U) == 0) {
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponentGroup>_>
    ::_Rb_tree_iterator(&local_78);
    local_80 = (_Base_ptr)
               std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponentGroup,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponentGroup>_>_>
               ::begin(&(this->super_cmCPackGenerator).ComponentGroups);
    local_78._M_node = local_80;
    while( true ) {
      local_88._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponentGroup,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponentGroup>_>_>
           ::end(&(this->super_cmCPackGenerator).ComponentGroups);
      bVar3 = std::operator!=(&local_78,&local_88);
      if (!bVar3) break;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_200);
      poVar8 = std::operator<<((ostream *)local_200,"Packaging component group: ");
      ppVar6 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponentGroup>_>
               ::operator->(&local_78);
      poVar8 = std::operator<<(poVar8,(string *)ppVar6);
      std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
      pcVar1 = (this->super_cmCPackGenerator).Logger;
      std::__cxx11::ostringstream::str();
      pcVar5 = (char *)std::__cxx11::string::c_str();
      cmCPackLog::Log(pcVar1,2,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CPack/cmCPackRPMGenerator.cxx"
                      ,0x73,pcVar5);
      std::__cxx11::string::~string(local_220);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_200);
      std::__cxx11::string::string((string *)&local_240,local_38);
      ppVar6 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponentGroup>_>
               ::operator->(&local_78);
      std::__cxx11::string::string((string *)&compIt,(string *)ppVar6);
      uVar4 = PackageOnePack(this,&local_240,(string *)&compIt);
      initialTopLevel.field_2._8_4_ = uVar4 & initialTopLevel.field_2._8_4_;
      std::__cxx11::string::~string((string *)&compIt);
      std::__cxx11::string::~string((string *)&local_240);
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponentGroup>_>
      ::operator++(&local_78);
    }
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>_>
    ::_Rb_tree_iterator(&local_268);
    local_270 = (_Base_ptr)
                std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>_>_>
                ::begin(&(this->super_cmCPackGenerator).Components);
    local_268._M_node = local_270;
    while( true ) {
      local_278._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>_>_>
           ::end(&(this->super_cmCPackGenerator).Components);
      bVar3 = std::operator!=(&local_268,&local_278);
      if (!bVar3) break;
      ppVar7 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>_>
               ::operator->(&local_268);
      if ((ppVar7->second).Group == (cmCPackComponentGroup *)0x0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3f0);
        poVar8 = std::operator<<((ostream *)local_3f0,"Component <");
        ppVar7 = std::
                 _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>_>
                 ::operator->(&local_268);
        poVar8 = std::operator<<(poVar8,(string *)&ppVar7->second);
        poVar8 = std::operator<<(poVar8,"> does not belong to any group, package it separately.");
        std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
        pcVar1 = (this->super_cmCPackGenerator).Logger;
        std::__cxx11::ostringstream::str();
        pcVar5 = (char *)std::__cxx11::string::c_str();
        cmCPackLog::Log(pcVar1,2,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CPack/cmCPackRPMGenerator.cxx"
                        ,0x82,pcVar5);
        std::__cxx11::string::~string(local_410);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3f0);
        std::__cxx11::string::string((string *)&local_430,local_38);
        ppVar7 = std::
                 _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>_>
                 ::operator->(&local_268);
        std::__cxx11::string::string((string *)&compIt_1,(string *)ppVar7);
        uVar4 = PackageOnePack(this,&local_430,(string *)&compIt_1);
        initialTopLevel.field_2._8_4_ = uVar4 & initialTopLevel.field_2._8_4_;
        std::__cxx11::string::~string((string *)&compIt_1);
        std::__cxx11::string::~string((string *)&local_430);
      }
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>_>
      ::operator++(&local_268);
    }
  }
  else {
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>_>
    ::_Rb_tree_iterator(&local_458);
    local_460 = (_Base_ptr)
                std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>_>_>
                ::begin(&(this->super_cmCPackGenerator).Components);
    local_458._M_node = local_460;
    while( true ) {
      local_468._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>_>_>
           ::end(&(this->super_cmCPackGenerator).Components);
      bVar3 = std::operator!=(&local_458,&local_468);
      if (!bVar3) break;
      std::__cxx11::string::string((string *)&local_488,local_38);
      ppVar7 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>_>
               ::operator->(&local_458);
      std::__cxx11::string::string((string *)&local_4a8,(string *)ppVar7);
      uVar4 = PackageOnePack(this,&local_488,&local_4a8);
      initialTopLevel.field_2._8_4_ = uVar4 & initialTopLevel.field_2._8_4_;
      std::__cxx11::string::~string((string *)&local_4a8);
      std::__cxx11::string::~string((string *)&local_488);
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>_>
      ::operator++(&local_458);
    }
  }
  uVar2 = initialTopLevel.field_2._8_4_;
  std::__cxx11::string::~string(local_38);
  return uVar2;
}

Assistant:

int cmCPackRPMGenerator::PackageComponents(bool ignoreGroup)
{
  int retval = 1;
  /* Reset package file name list it will be populated during the
   * component packaging run*/
  packageFileNames.clear();
  std::string initialTopLevel(this->GetOption("CPACK_TEMPORARY_DIRECTORY"));

  // The default behavior is to have one package by component group
  // unless CPACK_COMPONENTS_IGNORE_GROUP is specified.
  if (!ignoreGroup)
    {
    std::map<std::string, cmCPackComponentGroup>::iterator compGIt;
    for (compGIt=this->ComponentGroups.begin();
        compGIt!=this->ComponentGroups.end(); ++compGIt)
      {
      cmCPackLogger(cmCPackLog::LOG_VERBOSE, "Packaging component group: "
          << compGIt->first
          << std::endl);
      retval &= PackageOnePack(initialTopLevel,compGIt->first);
      }
    // Handle Orphan components (components not belonging to any groups)
    std::map<std::string, cmCPackComponent>::iterator compIt;
    for (compIt=this->Components.begin();
        compIt!=this->Components.end(); ++compIt )
      {
      // Does the component belong to a group?
      if (compIt->second.Group==NULL)
        {
        cmCPackLogger(cmCPackLog::LOG_VERBOSE,
            "Component <"
            << compIt->second.Name
            << "> does not belong to any group, package it separately."
            << std::endl);
        retval &= PackageOnePack(initialTopLevel,compIt->first);
        }
      }
    }
  // CPACK_COMPONENTS_IGNORE_GROUPS is set
  // We build 1 package per component
  else
    {
    std::map<std::string, cmCPackComponent>::iterator compIt;
    for (compIt=this->Components.begin();
         compIt!=this->Components.end(); ++compIt )
      {
      retval &= PackageOnePack(initialTopLevel,compIt->first);
      }
    }
  return retval;
}